

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O2

ssize_t __thiscall
drace::detector::Fasttrack<std::shared_mutex>::write
          (Fasttrack<std::shared_mutex> *this,int __fd,void *__buf,size_t __n)

{
  uint32_t *puVar1;
  __int_type _Var2;
  bool bVar3;
  TID thr1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  ThreadState *t;
  uint32_t thr2;
  
  t = (ThreadState *)CONCAT44(in_register_00000034,__fd);
  _Var2 = (t->id).super___atomic_base<unsigned_long>._M_i;
  if (_Var2 == *(__int_type *)((long)__buf + 8)) {
    if (this->log_flag == true) {
      puVar1 = &(this->log_count).write_same_epoch;
      *puVar1 = *puVar1 + 1;
    }
    return _Var2;
  }
  if (*(long *)((long)__buf + 8) == 0) {
    if (this->log_flag == true) {
      puVar1 = &(this->log_count).write_exclusive;
      *puVar1 = *puVar1 + 1;
    }
  }
  else {
    _Var2 = (t->id).super___atomic_base<unsigned_long>._M_i;
    bVar3 = VarState::is_ww_race((VarState *)__buf,t);
    thr2 = (uint32_t)(_Var2 >> 0x20);
    if (bVar3) {
      report_race_locked(this,(uint32_t)((ulong)*(undefined8 *)((long)__buf + 8) >> 0x20),thr2,true,
                         true,(VarState *)__buf,__n);
    }
    if (*__buf == 0) {
      if (this->log_flag != false) {
        puVar1 = &(this->log_count).write_exclusive;
        *puVar1 = *puVar1 + 1;
      }
      bVar3 = VarState::is_rw_ex_race((VarState *)__buf,t);
      if (!bVar3) goto LAB_0010e138;
      thr1 = (TID)((ulong)*(undefined8 *)((long)__buf + 0x10) >> 0x20);
      thr2 = (uint32_t)((t->id).super___atomic_base<unsigned_long>._M_i >> 0x20);
    }
    else {
      if (this->log_flag != false) {
        puVar1 = &(this->log_count).write_shared;
        *puVar1 = *puVar1 + 1;
      }
      thr1 = VarState::is_rw_sh_race((VarState *)__buf,t);
      if (thr1 == 0) goto LAB_0010e138;
    }
    report_race_locked(this,thr1,thr2,false,true,(VarState *)__buf,__n);
  }
LAB_0010e138:
  VarState::update((VarState *)__buf,true,(t->id).super___atomic_base<unsigned_long>._M_i);
  return extraout_RAX;
}

Assistant:

void write(ThreadState* t, VarState* v, size_t addr) {
    if (t->return_own_id() == v->get_write_id()) {  // write same epoch
      if (log_flag) {
        log_count.write_same_epoch++;
      }
      return;
    }

    if (v->get_write_id() ==
        VarState::VAR_NOT_INIT) {  // initial write, update var
      if (log_flag) {
        log_count.write_exclusive++;
      }
      v->update(true, t->return_own_id());
      return;
    }

    uint32_t tid = t->get_tid();

    // tids are different and write epoch greater or equal than known epoch of
    // other thread
    if (v->is_ww_race(t))  // write-write race
    {
      report_race_locked(v->get_w_tid(), tid, true, true, *v, addr);
    }

    if (!v->is_read_shared()) {
      if (log_flag) {
        log_count.write_exclusive++;
      }
      if (v->is_rw_ex_race(t))  // read-write race
      {
        report_race_locked(v->get_r_tid(), t->get_tid(), false, true, *v, addr);
      }
    } else {  // come here in read shared case
      if (log_flag) {
        log_count.write_shared++;
      }
      uint32_t act_tid = v->is_rw_sh_race(t);
      if (act_tid != 0)  // read shared read-write race
      {
        report_race_locked(act_tid, tid, false, true, *v, addr);
      }
    }
    v->update(true, t->return_own_id());
  }